

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

StringRef llvm::dwarf::TagString(uint Tag)

{
  undefined1 auStack_18 [4];
  uint Tag_local;
  
  if (Tag == 0) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_null");
  }
  else if (Tag == 1) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_array_type");
  }
  else if (Tag == 2) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_class_type");
  }
  else if (Tag == 3) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_entry_point");
  }
  else if (Tag == 4) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_enumeration_type");
  }
  else if (Tag == 5) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_formal_parameter");
  }
  else if (Tag == 8) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_imported_declaration");
  }
  else if (Tag == 10) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_label");
  }
  else if (Tag == 0xb) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_lexical_block");
  }
  else if (Tag == 0xd) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_member");
  }
  else if (Tag == 0xf) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_pointer_type");
  }
  else if (Tag == 0x10) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_reference_type");
  }
  else if (Tag == 0x11) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_compile_unit");
  }
  else if (Tag == 0x12) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_string_type");
  }
  else if (Tag == 0x13) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_structure_type");
  }
  else if (Tag == 0x15) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_subroutine_type");
  }
  else if (Tag == 0x16) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_typedef");
  }
  else if (Tag == 0x17) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_union_type");
  }
  else if (Tag == 0x18) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_unspecified_parameters");
  }
  else if (Tag == 0x19) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_variant");
  }
  else if (Tag == 0x1a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_common_block");
  }
  else if (Tag == 0x1b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_common_inclusion");
  }
  else if (Tag == 0x1c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_inheritance");
  }
  else if (Tag == 0x1d) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_inlined_subroutine");
  }
  else if (Tag == 0x1e) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_module");
  }
  else if (Tag == 0x1f) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_ptr_to_member_type");
  }
  else if (Tag == 0x20) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_set_type");
  }
  else if (Tag == 0x21) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_subrange_type");
  }
  else if (Tag == 0x22) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_with_stmt");
  }
  else if (Tag == 0x23) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_access_declaration");
  }
  else if (Tag == 0x24) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_base_type");
  }
  else if (Tag == 0x25) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_catch_block");
  }
  else if (Tag == 0x26) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_const_type");
  }
  else if (Tag == 0x27) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_constant");
  }
  else if (Tag == 0x28) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_enumerator");
  }
  else if (Tag == 0x29) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_file_type");
  }
  else if (Tag == 0x2a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_friend");
  }
  else if (Tag == 0x2b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_namelist");
  }
  else if (Tag == 0x2c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_namelist_item");
  }
  else if (Tag == 0x2d) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_packed_type");
  }
  else if (Tag == 0x2e) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_subprogram");
  }
  else if (Tag == 0x2f) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_template_type_parameter");
  }
  else if (Tag == 0x30) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_template_value_parameter");
  }
  else if (Tag == 0x31) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_thrown_type");
  }
  else if (Tag == 0x32) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_try_block");
  }
  else if (Tag == 0x33) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_variant_part");
  }
  else if (Tag == 0x34) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_variable");
  }
  else if (Tag == 0x35) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_volatile_type");
  }
  else if (Tag == 0x36) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_dwarf_procedure");
  }
  else if (Tag == 0x37) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_restrict_type");
  }
  else if (Tag == 0x38) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_interface_type");
  }
  else if (Tag == 0x39) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_namespace");
  }
  else if (Tag == 0x3a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_imported_module");
  }
  else if (Tag == 0x3b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_unspecified_type");
  }
  else if (Tag == 0x3c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_partial_unit");
  }
  else if (Tag == 0x3d) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_imported_unit");
  }
  else if (Tag == 0x3f) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_condition");
  }
  else if (Tag == 0x40) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_shared_type");
  }
  else if (Tag == 0x41) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_type_unit");
  }
  else if (Tag == 0x42) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_rvalue_reference_type");
  }
  else if (Tag == 0x43) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_template_alias");
  }
  else if (Tag == 0x44) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_coarray_type");
  }
  else if (Tag == 0x45) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_generic_subrange");
  }
  else if (Tag == 0x46) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_dynamic_type");
  }
  else if (Tag == 0x47) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_atomic_type");
  }
  else if (Tag == 0x48) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_call_site");
  }
  else if (Tag == 0x49) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_call_site_parameter");
  }
  else if (Tag == 0x4a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_skeleton_unit");
  }
  else if (Tag == 0x4b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_immutable_type");
  }
  else if (Tag == 0x4081) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_MIPS_loop");
  }
  else if (Tag == 0x4101) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_format_label");
  }
  else if (Tag == 0x4102) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_function_template");
  }
  else if (Tag == 0x4103) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_class_template");
  }
  else if (Tag == 0x4106) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_GNU_template_template_param");
  }
  else if (Tag == 0x4107) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_GNU_template_parameter_pack");
  }
  else if (Tag == 0x4108) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_GNU_formal_parameter_pack");
  }
  else if (Tag == 0x4109) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_GNU_call_site");
  }
  else if (Tag == 0x410a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_GNU_call_site_parameter");
  }
  else if (Tag == 0x4200) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_APPLE_property");
  }
  else if (Tag == 0xb000) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_BORLAND_property");
  }
  else if (Tag == 0xb001) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_BORLAND_Delphi_string");
  }
  else if (Tag == 0xb002) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_BORLAND_Delphi_dynamic_array");
  }
  else if (Tag == 0xb003) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_BORLAND_Delphi_set");
  }
  else if (Tag == 0xb004) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_TAG_BORLAND_Delphi_variant");
  }
  else {
    memset(auStack_18,0,0x10);
    StringRef::StringRef((StringRef *)auStack_18);
  }
  return _auStack_18;
}

Assistant:

StringRef llvm::dwarf::TagString(unsigned Tag) {
  switch (Tag) {
  default:
    return StringRef();
#define HANDLE_DW_TAG(ID, NAME, VERSION, VENDOR, KIND)                         \
  case DW_TAG_##NAME:                                                          \
    return "DW_TAG_" #NAME;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}